

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::TextTrieMap::search
          (TextTrieMap *this,CharacterNode *node,UnicodeString *text,int32_t start,int32_t index,
          TextTrieMapSearchResultHandler *handler,UErrorCode *status)

{
  CharacterNode *pCVar1;
  short sVar2;
  char16_t cVar3;
  int iVar4;
  uint uVar5;
  char16_t *pcVar6;
  ushort uVar7;
  int32_t index_00;
  ulong uVar8;
  ulong uVar9;
  char16_t cVar10;
  uint16_t uVar11;
  CharacterNode *pCVar12;
  UnicodeString tmp;
  UnicodeString local_70;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     ((node->fValues == (void *)0x0 ||
      ((iVar4 = (**handler->_vptr_TextTrieMapSearchResultHandler)
                          (handler,(ulong)(uint)(index - start),node), (char)iVar4 != '\0' &&
       (*status < U_ILLEGAL_ARGUMENT_ERROR)))))) {
    if (this->fIgnoreCase == '\0') {
      sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        uVar5 = (text->fUnion).fFields.fLength;
      }
      else {
        uVar5 = (int)sVar2 >> 5;
      }
      cVar10 = L'\xffff';
      if ((uint)index < uVar5) {
        if (((int)sVar2 & 2U) == 0) {
          pcVar6 = (text->fUnion).fFields.fArray;
        }
        else {
          pcVar6 = (char16_t *)((long)&text->fUnion + 2);
        }
        cVar10 = pcVar6[index];
      }
      index_00 = index + 1;
      uVar7 = node->fFirstChild;
      pCVar12 = node;
      do {
        if (uVar7 == 0) goto LAB_002043ac;
        pCVar1 = this->fNodes + uVar7;
        iVar4 = 1;
        cVar3 = this->fNodes[uVar7].fCharacter;
        node = pCVar1;
        if ((cVar3 != cVar10) && (iVar4 = 3, node = pCVar12, (ushort)cVar3 <= (ushort)cVar10)) {
          uVar7 = pCVar1->fNextSibling;
          iVar4 = 0;
        }
        pCVar12 = node;
      } while (iVar4 == 0);
      if (iVar4 == 3) {
LAB_002043ac:
        node = (CharacterNode *)0x0;
      }
    }
    else {
      uVar5 = UnicodeString::char32At(text,index);
      UnicodeString::UnicodeString(&local_70,uVar5);
      UnicodeString::foldCase(&local_70,0);
      if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
        local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (((int)local_70.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        local_70.fUnion.fFields.fArray = local_70.fUnion.fStackFields.fBuffer;
      }
      index_00 = (index - (uint)(uVar5 < 0x10000)) + 2;
      uVar8 = 0;
      uVar9 = 0;
      if (0 < local_70.fUnion.fFields.fLength) {
        uVar9 = (ulong)(uint)local_70.fUnion.fFields.fLength;
      }
      do {
        if (uVar8 == uVar9) break;
        if (local_70.fUnion.fFields.fLength == 0) {
          cVar10 = L'\xffff';
        }
        else {
          cVar10 = *(char16_t *)((long)local_70.fUnion.fFields.fArray + uVar8 * 2);
        }
        uVar8 = uVar8 + 1;
        uVar11 = node->fFirstChild;
        pCVar12 = node;
        do {
          if (uVar11 == 0) goto LAB_00204322;
          pCVar1 = this->fNodes + uVar11;
          iVar4 = 1;
          cVar3 = this->fNodes[uVar11].fCharacter;
          node = pCVar1;
          if ((cVar3 != cVar10) && (iVar4 = 3, node = pCVar12, (ushort)cVar3 <= (ushort)cVar10)) {
            uVar11 = pCVar1->fNextSibling;
            iVar4 = 0;
          }
          pCVar12 = node;
        } while (iVar4 == 0);
        if (iVar4 == 3) {
LAB_00204322:
          node = (CharacterNode *)0x0;
        }
      } while (node != (CharacterNode *)0x0);
      UnicodeString::~UnicodeString(&local_70);
    }
    if (node != (CharacterNode *)0x0) {
      search(this,node,text,start,index_00,handler,status);
    }
  }
  return;
}

Assistant:

void
TextTrieMap::search(CharacterNode *node, const UnicodeString &text, int32_t start,
                  int32_t index, TextTrieMapSearchResultHandler *handler, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return;
    }
    if (node->hasValues()) {
        if (!handler->handleMatch(index - start, node, status)) {
            return;
        }
        if (U_FAILURE(status)) {
            return;
        }
    }
    if (fIgnoreCase) {
        // for folding we need to get a complete code point.
        // size of character may grow after fold operation;
        // then we need to get result as UTF16 code units.
        UChar32 c32 = text.char32At(index);
        index += U16_LENGTH(c32);
        UnicodeString tmp(c32);
        tmp.foldCase();
        int32_t tmpidx = 0;
        while (tmpidx < tmp.length()) {
            UChar c = tmp.charAt(tmpidx++);
            node = getChildNode(node, c);
            if (node == NULL) {
                break;
            }
        }
    } else {
        // here we just get the next UTF16 code unit
        UChar c = text.charAt(index++);
        node = getChildNode(node, c);
    }
    if (node != NULL) {
        search(node, text, start, index, handler, status);
    }
}